

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

uint32_t ScaleDown(uint16_t a,uint16_t b,uint16_t c,uint16_t d,int rgb_bit_depth,
                  SharpYuvTransferFunctionType transfer_type)

{
  uint16_t uVar1;
  int iVar2;
  SharpYuvTransferFunctionType transfer_type_00;
  int in_R8D;
  uint32_t in_R9D;
  uint32_t D;
  uint32_t C;
  uint32_t B;
  uint32_t A;
  int bit_depth;
  SharpYuvTransferFunctionType in_stack_ffffffffffffffe8;
  
  iVar2 = GetPrecisionShift(in_R8D);
  iVar2 = in_R8D + iVar2;
  transfer_type_00 =
       SharpYuvGammaToLinear((uint16_t)(in_R9D >> 0x10),iVar2,in_stack_ffffffffffffffe8);
  SharpYuvGammaToLinear((uint16_t)(in_R9D >> 0x10),iVar2,transfer_type_00);
  SharpYuvGammaToLinear((uint16_t)(in_R9D >> 0x10),iVar2,transfer_type_00);
  SharpYuvGammaToLinear((uint16_t)(in_R9D >> 0x10),iVar2,transfer_type_00);
  uVar1 = SharpYuvLinearToGamma(in_R9D,iVar2,transfer_type_00);
  return (uint32_t)uVar1;
}

Assistant:

static uint32_t ScaleDown(uint16_t a, uint16_t b, uint16_t c, uint16_t d,
                          int rgb_bit_depth,
                          SharpYuvTransferFunctionType transfer_type) {
  const int bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  const uint32_t A = SharpYuvGammaToLinear(a, bit_depth, transfer_type);
  const uint32_t B = SharpYuvGammaToLinear(b, bit_depth, transfer_type);
  const uint32_t C = SharpYuvGammaToLinear(c, bit_depth, transfer_type);
  const uint32_t D = SharpYuvGammaToLinear(d, bit_depth, transfer_type);
  return SharpYuvLinearToGamma((A + B + C + D + 2) >> 2, bit_depth,
                               transfer_type);
}